

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

bool __thiscall
iDynTree::Model::updateInertialParameters(Model *this,VectorDynSize *modelInertialParams)

{
  long lVar1;
  long lVar2;
  SpatialInertia *pSVar3;
  pointer pLVar4;
  long lVar5;
  long lVar6;
  pointer pLVar7;
  LinkIndex linkIdx;
  ulong uVar8;
  long lVar9;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_e8;
  Vector10 *local_d0 [2];
  Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>
  local_c0;
  Vector10 inertiaParamsBuf;
  
  lVar1 = iDynTree::VectorDynSize::size();
  pLVar7 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_start;
  pLVar4 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_finish;
  lVar2 = (((long)pLVar4 - (long)pLVar7) / 0x70) * 10;
  if (lVar1 == lVar2) {
    lVar6 = 0;
    lVar5 = 0;
    lVar9 = 0;
    for (uVar8 = 0; uVar8 < (ulong)(((long)pLVar4 - (long)pLVar7) / 0x70); uVar8 = uVar8 + 1) {
      toEigen(&local_e8,modelInertialParams);
      local_c0.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>,_0>
      .m_data = (PointerType)
                ((long)local_e8.
                       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data + lVar6);
      local_c0.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      ._16_1_ = local_e8.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ._16_1_;
      local_c0.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_e8.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_c0.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_e8.
           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_c0.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
      .m_outerStride =
           local_e8.
           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_d0[0] = &inertiaParamsBuf;
      local_c0.
      super_BlockImpl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false,_true>
      .m_startRow.m_value = lVar5;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,10,1,0,10,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,10,1,false>>
                ((Map<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0,_Eigen::Stride<0,_0>_> *)local_d0,
                 &local_c0);
      pSVar3 = Link::inertia((Link *)((long)(((this->links).
                                              super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_inertia)
                                            .m_mcom + lVar9 + 0xfffffffffffffff0U));
      iDynTree::SpatialInertia::fromVector((VectorFixSize *)pSVar3);
      pLVar7 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pLVar4 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar9 = lVar9 + 0x70;
      lVar5 = lVar5 + 10;
      lVar6 = lVar6 + 0x50;
    }
  }
  else {
    iDynTree::reportError
              ("Model","updateInertialParameters",
               "modelInertialParams has the wrong number of parameters");
  }
  return lVar1 == lVar2;
}

Assistant:

bool Model::updateInertialParameters(const VectorDynSize& modelInertialParams)
{
    if( modelInertialParams.size() != this->getNrOfLinks()*10 )
    {
        reportError("Model","updateInertialParameters","modelInertialParams has the wrong number of parameters");
        return false;
    }

    for(LinkIndex linkIdx = 0; linkIdx < this->getNrOfLinks(); linkIdx++ )
    {
        Vector10       inertiaParamsBuf;
        toEigen(inertiaParamsBuf) = toEigen(modelInertialParams).segment<10>(10*linkIdx);

        links[linkIdx].inertia().fromVector(inertiaParamsBuf);
    }

    return true;
}